

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 wrapS_00;
  deUint32 wrapT_00;
  char *__s;
  Context *pCVar3;
  uint minFilter_00;
  TestNode *node;
  TestNode *pTVar4;
  TextureCubeArrayFilteringCase *pTVar5;
  char *pcVar6;
  ulong extraout_RAX;
  ulong uVar7;
  deUint32 local_3c8;
  bool local_3c1;
  deUint32 local_390;
  bool local_389;
  deUint32 filter;
  bool isLinear;
  int isLinearI;
  TestCaseGroup *onlyFaceInteriorGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [8];
  string name_2;
  int depth_2;
  int size_2;
  deUint32 wrapT_2;
  deUint32 wrapS_2;
  deUint32 format_2;
  deUint32 magFilter_2;
  deUint32 minFilter_2;
  int wrapTNdx;
  int wrapSNdx;
  int magFilterNdx;
  int minFilterNdx;
  TestCaseGroup *combinationsGroup;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string name_1;
  int local_110;
  int depth_1;
  int size_1;
  deUint32 wrapT_1;
  deUint32 wrapS_1;
  deUint32 magFilter_1;
  bool isMipmap_1;
  char *pcStack_f8;
  deUint32 format_1;
  char *filterName_1;
  int local_e8;
  deUint32 minFilter_1;
  int filterNdx_1;
  int sizeNdx;
  TestCaseGroup *sizesGroup;
  undefined4 local_d0;
  int depth;
  int size;
  deUint32 wrapT;
  deUint32 wrapS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  deUint32 magFilter;
  bool isMipmap;
  char *formatName;
  deUint32 format;
  char *filterName;
  int local_38;
  deUint32 minFilter;
  int filterNdx;
  int fmtNdx;
  TestCaseGroup *formatsGroup;
  TestCaseGroup *groupCubeArray;
  TextureFilteringTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Cube Map Array Texture Filtering");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"formats",
             "Cube Map Array Texture Formats");
  tcu::TestNode::addChild(node,pTVar4);
  for (minFilter = 0; (int)minFilter < 10; minFilter = minFilter + 1) {
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      dVar1 = init::minFilterModes[local_38].mode;
      pcVar6 = init::minFilterModes[local_38].name;
      dVar2 = init::filterableFormatsByType[(int)minFilter].format;
      __s = init::filterableFormatsByType[(int)minFilter].name;
      local_389 = dVar1 != 0x2600 && dVar1 != 0x2601;
      name.field_2._M_local_buf[0xf] = local_389;
      local_390 = dVar1;
      if (dVar1 != 0x2600 && dVar1 != 0x2601) {
        local_390 = 0x2601;
      }
      name.field_2._8_4_ = local_390;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&wrapS,__s,(allocator<char> *)((long)&wrapT + 3));
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wrapS,"_"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_a0,pcVar6);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&wrapS);
      std::allocator<char>::~allocator((allocator<char> *)((long)&wrapT + 3));
      size = 0x2901;
      depth = 0x2901;
      local_d0 = 0x40;
      sizesGroup._4_4_ = 0xc;
      pTVar5 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar5,pCVar3,pcVar6,"",dVar1,name.field_2._8_4_,0x2901,0x2901,dVar2,0x40,0xc,false
                );
      tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sizes",
             "Texture Sizes");
  _filterNdx_1 = pTVar4;
  tcu::TestNode::addChild(node,pTVar4);
  for (minFilter_1 = 0; (int)minFilter_1 < 5; minFilter_1 = minFilter_1 + 1) {
    for (local_e8 = 0; local_e8 < 6; local_e8 = local_e8 + 1) {
      filterName_1._4_4_ = init::minFilterModes[local_e8].mode;
      pcStack_f8 = init::minFilterModes[local_e8].name;
      magFilter_1 = 0x8058;
      local_3c1 = filterName_1._4_4_ != 0x2600 && filterName_1._4_4_ != 0x2601;
      wrapS_1._3_1_ = local_3c1;
      local_3c8 = filterName_1._4_4_;
      if (filterName_1._4_4_ != 0x2600 && filterName_1._4_4_ != 0x2601) {
        local_3c8 = 0x2601;
      }
      wrapT_1 = local_3c8;
      size_1 = 0x2901;
      depth_1 = 0x2901;
      local_110 = init::sizesCubeArray[(int)minFilter_1].size;
      name_1.field_2._12_4_ = init::sizesCubeArray[(int)minFilter_1].depth;
      de::toString<int>(&local_1f8,&local_110);
      std::operator+(&local_1d8,&local_1f8,"x");
      de::toString<int>(&local_218,&local_110);
      std::operator+(&local_1b8,&local_1d8,&local_218);
      std::operator+(&local_198,&local_1b8,"x");
      de::toString<int>((string *)&combinationsGroup,(int *)(name_1.field_2._M_local_buf + 0xc));
      std::operator+(&local_178,&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &combinationsGroup);
      std::operator+(&local_158,&local_178,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_158,pcStack_f8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&combinationsGroup);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      pTVar4 = _filterNdx_1;
      pTVar5 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar5,pCVar3,pcVar6,"",filterName_1._4_4_,wrapT_1,0x2901,0x2901,0x8058,local_110,
                 name_1.field_2._12_4_,false);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
      std::__cxx11::string::~string((string *)local_138);
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combinations"
             ,"Filter and wrap mode combinations");
  tcu::TestNode::addChild(node,pTVar4);
  for (wrapSNdx = 0; wrapSNdx < 6; wrapSNdx = wrapSNdx + 1) {
    for (wrapTNdx = 0; wrapTNdx < 2; wrapTNdx = wrapTNdx + 1) {
      for (minFilter_2 = 0; (int)minFilter_2 < 3; minFilter_2 = minFilter_2 + 1) {
        for (magFilter_2 = 0; (int)magFilter_2 < 3; magFilter_2 = magFilter_2 + 1) {
          dVar1 = init::minFilterModes[wrapSNdx].mode;
          dVar2 = init::magFilterModes[wrapTNdx].mode;
          wrapS_00 = init::wrapModes[(int)minFilter_2].mode;
          wrapT_00 = init::wrapModes[(int)magFilter_2].mode;
          name_2.field_2._12_4_ = 0xc;
          pcVar6 = init::minFilterModes[wrapSNdx].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,pcVar6,
                     (allocator<char> *)((long)&onlyFaceInteriorGroup + 7));
          std::operator+(&local_330,&local_350,"_");
          std::operator+(&local_310,&local_330,init::magFilterModes[wrapTNdx].name);
          std::operator+(&local_2f0,&local_310,"_");
          std::operator+(&local_2d0,&local_2f0,init::wrapModes[(int)minFilter_2].name);
          std::operator+(&local_2b0,&local_2d0,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_290,&local_2b0,init::wrapModes[(int)magFilter_2].name);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator((allocator<char> *)((long)&onlyFaceInteriorGroup + 7));
          pTVar5 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                    (pTVar5,pCVar3,pcVar6,"",dVar1,dVar2,wrapS_00,wrapT_00,0x8058,0x3f,0xc,false);
          tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
          std::__cxx11::string::~string((string *)local_290);
        }
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "no_edges_visible","Don\'t sample anywhere near a face\'s edges");
  tcu::TestNode::addChild(node,pTVar4);
  filter = 0;
  uVar7 = extraout_RAX;
  while ((int)filter < 2) {
    minFilter_00 = filter != 0 | 0x2600;
    pTVar5 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
    pcVar6 = "linear_mipmap_nearest";
    if (filter != 0) {
      pcVar6 = "linear_mipmap_linear";
    }
    TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
              (pTVar5,(this->super_TestCaseGroup).m_context,pcVar6 + 0xe,"",minFilter_00,
               minFilter_00,0x2901,0x2901,0x8058,0x3f,0xc,true);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
    filter = filter + 1;
    uVar7 = (ulong)filter;
  }
  return (int)uVar7;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		int size;
		int depth;
	} sizesCubeArray[] =
	{
		{   8,	 6 },
		{  64,	12 },
		{ 128,	12 },
		{   7,	12 },
		{  63,	18 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} filterableFormatsByType[] =
	{
		{ "rgba16f",		GL_RGBA16F			},
		{ "r11f_g11f_b10f",	GL_R11F_G11F_B10F	},
		{ "rgb9_e5",		GL_RGB9_E5			},
		{ "rgba8",			GL_RGBA8			},
		{ "rgba8_snorm",	GL_RGBA8_SNORM		},
		{ "rgb565",			GL_RGB565			},
		{ "rgba4",			GL_RGBA4			},
		{ "rgb5_a1",		GL_RGB5_A1			},
		{ "srgb8_alpha8",	GL_SRGB8_ALPHA8		},
		{ "rgb10_a2",		GL_RGB10_A2			}
	};

	// Cube map array texture filtering.
	{
		tcu::TestCaseGroup* const groupCubeArray = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Cube Map Array Texture Filtering");
		addChild(groupCubeArray);

		// Formats.
		{
			tcu::TestCaseGroup* const formatsGroup = new tcu::TestCaseGroup(m_testCtx, "formats", "Cube Map Array Texture Formats");
			groupCubeArray->addChild(formatsGroup);

			for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(filterableFormatsByType); fmtNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= filterableFormatsByType[fmtNdx].format;
					const char*		formatName	= filterableFormatsByType[fmtNdx].name;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const string	name		= string(formatName) + "_" + filterName;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= 64;
					const int		depth		= 12;

					formatsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																			 name.c_str(), "",
																			 minFilter, magFilter,
																			 wrapS, wrapT,
																			 format,
																			 size, depth));
				}
			}
		}

		// Sizes.
		{
			tcu::TestCaseGroup* const sizesGroup = new tcu::TestCaseGroup(m_testCtx, "sizes", "Texture Sizes");
			groupCubeArray->addChild(sizesGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCubeArray); sizeNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= GL_RGBA8;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= sizesCubeArray[sizeNdx].size;
					const int		depth		= sizesCubeArray[sizeNdx].depth;
					const string	name		= de::toString(size) + "x" + de::toString(size) + "x" + de::toString(depth) + "_" + filterName;

					sizesGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																		   name.c_str(), "",
																		   minFilter, magFilter,
																		   wrapS, wrapT,
																		   format,
																		   size, depth));
				}
			}
		}

		// Wrap modes.
		{
			tcu::TestCaseGroup* const combinationsGroup = new tcu::TestCaseGroup(m_testCtx, "combinations", "Filter and wrap mode combinations");
			groupCubeArray->addChild(combinationsGroup);

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); minFilterNdx++)
			{
				for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilterModes); magFilterNdx++)
				{
					for (int wrapSNdx = 0; wrapSNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapSNdx++)
					{
						for (int wrapTNdx = 0; wrapTNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapTNdx++)
						{
							const deUint32	minFilter	= minFilterModes[minFilterNdx].mode;
							const deUint32	magFilter	= magFilterModes[magFilterNdx].mode;
							const deUint32	format		= GL_RGBA8;
							const deUint32	wrapS		= wrapModes[wrapSNdx].mode;
							const deUint32	wrapT		= wrapModes[wrapTNdx].mode;
							const int		size		= 63;
							const int		depth		= 12;
							const string	name		= string(minFilterModes[minFilterNdx].name) + "_" + magFilterModes[magFilterNdx].name + "_" + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

							combinationsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																						  name.c_str(), "",
																						  minFilter, magFilter,
																						  wrapS, wrapT,
																						  format,
																						  size, depth));
						}
					}
				}
			}
		}

		// Cases with no visible cube edges.
		{
			tcu::TestCaseGroup* const onlyFaceInteriorGroup = new tcu::TestCaseGroup(m_testCtx, "no_edges_visible", "Don't sample anywhere near a face's edges");
			groupCubeArray->addChild(onlyFaceInteriorGroup);

			for (int isLinearI = 0; isLinearI <= 1; isLinearI++)
			{
				const bool		isLinear	= isLinearI != 0;
				const deUint32	filter		= isLinear ? GL_LINEAR : GL_NEAREST;

				onlyFaceInteriorGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																				  isLinear ? "linear" : "nearest", "",
																				  filter, filter,
																				  GL_REPEAT, GL_REPEAT,
																				  GL_RGBA8,
																				  63, 12,
																				  true));
			}
		}
	}
}